

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resldexe.cpp
# Opt level: O1

osfildef * __thiscall CResLoader::open_exe_res(CResLoader *this,char *respath,char *restype)

{
  FILE *__stream;
  CVmImageLoaderMres_resload res_ifc;
  CVmImageLoaderMres local_58;
  char *local_50;
  size_t local_48;
  int local_40;
  uint local_3c;
  char *local_30;
  
  if ((restype != (char *)0x0 && this->exe_filename_ != (char *)0x0) &&
     (__stream = (FILE *)os_exeseek(this->exe_filename_,restype), __stream != (FILE *)0x0)) {
    local_58._vptr_CVmImageLoaderMres = (_func_int **)&PTR__CVmImageLoaderMres_resload_00312f10;
    local_50 = respath;
    local_48 = strlen(respath);
    local_40 = 0;
    local_30 = (char *)0x0;
    CVmImageLoader::load_resources_from_fp((osfildef *)__stream,this->exe_filename_,&local_58);
    if (local_40 == 0) {
      fclose(__stream);
      __stream = (FILE *)0x0;
    }
    else if (local_30 == (char *)0x0) {
      fseek(__stream,(ulong)local_3c,0);
    }
    else {
      fclose(__stream);
      __stream = fopen(local_30,"rb");
    }
    local_58._vptr_CVmImageLoaderMres = (_func_int **)&PTR__CVmImageLoaderMres_resload_00312f10;
    lib_free_str(local_30);
    return (osfildef *)__stream;
  }
  return (osfildef *)0x0;
}

Assistant:

osfildef *CResLoader::open_exe_res(const char *respath,
                                   const char *restype)
{
    osfildef *exe_fp;

    /* 
     *   if we don't have an executable filename stored, or we don't have an
     *   executable resource type ID, we can't load the resource 
     */
    if (exe_filename_ == 0 || restype == 0)
        return 0;
    
    /* find the executable file's resources */
    exe_fp = os_exeseek(exe_filename_, restype);

    /* if we found something, try loading from that file */
    if (exe_fp != 0)
    {
        CVmImageLoaderMres_resload res_ifc(respath);
        
        /* try loading the resources */
        CVmImageLoader::
            load_resources_from_fp(exe_fp, exe_filename_, &res_ifc);
        
        /* check to see if we found it */
        if (res_ifc.found_resource())
        {
            /* check the type */
            if (res_ifc.get_link_fname() != 0)
            {
                /* 
                 *   it's a linked local file - close the exe file and open
                 *   the local file instead 
                 */
                osfcls(exe_fp);
                exe_fp = osfoprb(res_ifc.get_link_fname(), OSFOPRB);
            }
            else
            {
                /* we got an exe resource - seek to the starting byte */
                osfseek(exe_fp, res_ifc.get_resource_seek(), OSFSK_SET);
            }
        }
        else
        {
            /* didn't find it - close and forget the executable file */
            osfcls(exe_fp);
            exe_fp = 0;
        }
    }

    /* return the executable file pointer, if we found the resource */
    return exe_fp;
}